

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStoreTestCase.cpp
# Opt level: O0

void __thiscall
SuiteFileStoreTests::resetBeforeAndAfterWithTestFileManager::resetBeforeAndAfterWithTestFileManager
          (resetBeforeAndAfterWithTestFileManager *this)

{
  string *beginString;
  string *senderCompID;
  string *targetCompID;
  FileStore *pFVar1;
  allocator<char> local_369;
  string local_368 [39];
  allocator<char> local_341;
  string local_340;
  allocator<char> local_319;
  STRING local_318;
  StringField local_2f8;
  allocator<char> local_291;
  STRING local_290;
  StringField local_270;
  allocator<char> local_209;
  STRING local_208;
  StringField local_1e8;
  undefined1 local_188 [8];
  SessionID sessionID;
  resetBeforeAndAfterWithTestFileManager *this_local;
  
  resetBeforeAndAfterFileStoreFixture::resetBeforeAndAfterFileStoreFixture
            (&this->super_resetBeforeAndAfterFileStoreFixture);
  FIX::FileStoreFactory::destroy((MessageStore *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"FIX.4.2",&local_209);
  FIX::BeginString::BeginString((BeginString *)&local_1e8,&local_208);
  beginString = FIX::StringField::operator_cast_to_string_(&local_1e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"SETGET",&local_291);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&local_270,&local_290);
  senderCompID = FIX::StringField::operator_cast_to_string_(&local_270);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"TEST",&local_319);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_2f8,&local_318);
  targetCompID = FIX::StringField::operator_cast_to_string_(&local_2f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"Test",&local_341);
  FIX::SessionID::SessionID((SessionID *)local_188,beginString,senderCompID,targetCompID,&local_340)
  ;
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator(&local_341);
  FIX::TargetCompID::~TargetCompID((TargetCompID *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  FIX::SenderCompID::~SenderCompID((SenderCompID *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  FIX::BeginString::~BeginString((BeginString *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  pFVar1 = (FileStore *)operator_new(0x130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_368,"store",&local_369);
  FIX::FileStore::FileStore(pFVar1,local_368,local_188);
  (this->super_resetBeforeAndAfterFileStoreFixture).super_fileStoreFixture.object =
       (MessageStore *)pFVar1;
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator(&local_369);
  FIX::SessionID::~SessionID((SessionID *)local_188);
  return;
}

Assistant:

resetBeforeAndAfterWithTestFileManager() : resetBeforeAndAfterFileStoreFixture() {
    factory.destroy( object );

    SessionID sessionID( BeginString( "FIX.4.2" ),
        SenderCompID( "SETGET" ), TargetCompID( "TEST" ), "Test" );

    object = new FileStore( "store", sessionID);
  }